

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportFragments.c
# Opt level: O1

sbfBuffer sbfTport_assemble(sbfTportStream tstream,sbfTportTopic ttopic,sbfTportHeader hdr)

{
  int *piVar1;
  pthread_spinlock_t *__lock;
  byte bVar2;
  long lVar3;
  void *pvVar4;
  sbfBuffer psVar5;
  long *plVar6;
  ulong uVar7;
  size_t sVar8;
  
  bVar2 = hdr->mFragNum;
  if (ttopic->mFragNum + 1 == (uint)bVar2) {
    if (ttopic->mFragData == (void *)0x0) {
      if (bVar2 != 1) goto LAB_00105fa3;
      ttopic->mFragAllocated = 0x2000;
      pvVar4 = (void *)sbfMemory_malloc(0x2000);
      ttopic->mFragData = pvVar4;
      ttopic->mFragNum = 1;
      ttopic->mFragSize = 0;
    }
    else {
      ttopic->mFragNum = (uint)bVar2;
    }
    sVar8 = ttopic->mFragSize;
    uVar7 = ttopic->mFragAllocated;
    while (uVar7 < sVar8 + hdr->mSize) {
      pvVar4 = (void *)sbfMemory_realloc(ttopic->mFragData,2);
      ttopic->mFragData = pvVar4;
      sVar8 = ttopic->mFragSize;
      uVar7 = ttopic->mFragAllocated * 2;
      ttopic->mFragAllocated = uVar7;
    }
    memcpy((void *)(sVar8 + (long)ttopic->mFragData),
           (void *)((long)&hdr[1].mSize + (ulong)hdr->mTopicSize),(ulong)hdr->mSize);
    sVar8 = (ulong)hdr->mSize + ttopic->mFragSize;
    ttopic->mFragSize = sVar8;
    if ((hdr->mFlags & 2) == 0) {
      return (sbfBuffer)0x0;
    }
    pvVar4 = ttopic->mFragData;
    if (_gSbfBufferDefaultPool == 0) {
      _gSbfBufferDefaultPool = sbfPool_create1(0x48,"sbfBuffer_wrap",0x58);
      sbfPool_registerAtExit(_gSbfBufferDefaultPool);
    }
    lVar3 = _gSbfBufferDefaultPool;
    LOCK();
    piVar1 = (int *)(*(long *)(_gSbfBufferDefaultPool + 0x28) + 0x18);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    __lock = (pthread_spinlock_t *)(lVar3 + 0x10);
    pthread_spin_lock(__lock);
    plVar6 = *(long **)(lVar3 + 0x18);
    if (plVar6 == (long *)0x0) {
      LOCK();
      plVar6 = *(long **)(lVar3 + 0x20);
      *(undefined8 *)(lVar3 + 0x20) = 0;
      UNLOCK();
    }
    if (plVar6 == (long *)0x0) {
      pthread_spin_unlock(__lock);
      LOCK();
      piVar1 = (int *)(*(long *)(lVar3 + 0x28) + 0x20);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      plVar6 = (long *)sbfMemory_malloc(*(undefined8 *)(lVar3 + 8));
      *plVar6 = lVar3;
      plVar6[1] = 0;
    }
    else {
      *(long *)(lVar3 + 0x18) = plVar6[1];
      pthread_spin_unlock(__lock);
    }
    psVar5 = (sbfBuffer)(plVar6 + 2);
    *(undefined4 *)(plVar6 + 2) = 0;
    plVar6[5] = (long)sbfTportFragmentBufferDestroyCb;
    plVar6[6] = (long)pvVar4;
    plVar6[7] = 0;
    plVar6[3] = (long)pvVar4;
    plVar6[4] = sVar8;
    plVar6[8] = 1;
  }
  else {
LAB_00105fa3:
    if (ttopic->mFragData != (void *)0x0) {
      free(ttopic->mFragData);
    }
    psVar5 = (sbfBuffer)0x0;
  }
  ttopic->mFragData = (void *)0x0;
  ttopic->mFragNum = 0;
  return psVar5;
}

Assistant:

sbfBuffer
sbfTport_assemble (sbfTportStream tstream,
                   sbfTportTopic ttopic,
                   sbfTportHeader hdr)
{
    sbfBuffer returned;

    if (hdr->mFragNum != ttopic->mFragNum + 1)
        goto invalid;

    if (ttopic->mFragData == NULL)
    {
        if (hdr->mFragNum != 1)
            goto invalid;

        ttopic->mFragAllocated = 8192;
        ttopic->mFragData = xmalloc (ttopic->mFragAllocated);

        ttopic->mFragNum = 1;
        ttopic->mFragSize = 0;
    }
    else
        ttopic->mFragNum = hdr->mFragNum;

    while (ttopic->mFragAllocated < ttopic->mFragSize + hdr->mSize)
    {
        ttopic->mFragData = xrealloc (ttopic->mFragData,
                                      2,
                                      ttopic->mFragAllocated);
        ttopic->mFragAllocated *= 2;
    }

    memcpy ((char*)ttopic->mFragData + ttopic->mFragSize,
            (char*)(hdr + 1) + hdr->mTopicSize,
            hdr->mSize);
    ttopic->mFragSize += hdr->mSize;

    if (!(hdr->mFlags & SBF_MESSAGE_FLAG_LAST_FRAGMENT))
        return NULL;
    returned = sbfBuffer_wrap (ttopic->mFragData,
                               ttopic->mFragSize,
                               sbfTportFragmentBufferDestroyCb,
                               NULL);

    ttopic->mFragData = NULL;
    ttopic->mFragNum = 0;
    return returned;

invalid:
    if (ttopic->mFragData != NULL)
        free (ttopic->mFragData);

    ttopic->mFragData = NULL;
    ttopic->mFragNum = 0;
    return NULL;
}